

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageSorters.h
# Opt level: O0

bool FIX::group_order::compare(int x,int y,int *order,int largest)

{
  int iVar1;
  int iVar2;
  int iY;
  int iX;
  int largest_local;
  int *order_local;
  int y_local;
  int x_local;
  
  if ((largest < x) || (largest < y)) {
    if (largest < x) {
      if (largest < y) {
        y_local._3_1_ = x < y;
      }
      else {
        y_local._3_1_ = false;
      }
    }
    else {
      y_local._3_1_ = true;
    }
  }
  else {
    iVar1 = order[x];
    iVar2 = order[y];
    if ((iVar1 == 0) && (iVar2 == 0)) {
      y_local._3_1_ = x < y;
    }
    else if (iVar1 == 0) {
      y_local._3_1_ = false;
    }
    else if (iVar2 == 0) {
      y_local._3_1_ = true;
    }
    else {
      y_local._3_1_ = iVar1 < iVar2;
    }
  }
  return y_local._3_1_;
}

Assistant:

static bool compare(const int x, const int y, int *order, int largest) {
    if (x <= largest && y <= largest) {
      int iX = order[x];
      int iY = order[y];
      if (iX == 0 && iY == 0) {
        return x < y;
      } else if (iX == 0) {
        return false;
      } else if (iY == 0) {
        return true;
      } else {
        return iX < iY;
      }
    } else if (x <= largest) {
      return true;
    } else if (y <= largest) {
      return false;
    } else {
      return x < y;
    }
  }